

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# starting_basis.cc
# Opt level: O2

void ipx::StartingBasis(Iterate *iterate,Basis *p_basis,Info *info)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Model *pMVar4;
  double *pdVar5;
  double dVar6;
  Info *pIVar7;
  pointer piVar8;
  bool bVar9;
  BasicStatus BVar10;
  pointer piVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t __n;
  pointer piVar15;
  int *piVar16;
  Int j;
  Int j_00;
  ulong uVar17;
  int local_c4;
  Info *local_c0;
  Vector dxbasic;
  Vector dy;
  vector<int,_std::allocator<int>_> dependent_rows;
  Vector colscale;
  Vector dx;
  vector<int,_std::allocator<int>_> dependent_cols;
  Timer timer;
  
  pMVar4 = iterate->model_;
  uVar14 = (long)pMVar4->num_cols_ + (long)pMVar4->num_rows_;
  std::valarray<double>::valarray(&colscale,uVar14);
  (info->super_ipx_info).errflag = 0;
  Timer::Timer(&timer);
  uVar17 = 0;
  uVar12 = uVar14 & 0xffffffff;
  if ((int)uVar14 < 1) {
    uVar12 = uVar17;
  }
  for (; uVar12 != uVar17; uVar17 = uVar17 + 1) {
    dVar6 = Iterate::ScalingFactor(iterate,(Int)uVar17);
    colscale._M_data[uVar17] = dVar6;
    dVar6 = (pMVar4->lb_)._M_data[uVar17];
    pdVar5 = (pMVar4->ub_)._M_data + uVar17;
    if ((dVar6 == *pdVar5) && (!NAN(dVar6) && !NAN(*pdVar5))) {
      colscale._M_data[uVar17] = 0.0;
    }
  }
  Basis::ConstructBasisFromWeights(p_basis,colscale._M_data,info);
  if ((info->super_ipx_info).errflag == 0) {
    local_c0 = info;
    for (uVar14 = 0; j_00 = (Int)uVar14, uVar12 != uVar14; uVar14 = uVar14 + 1) {
      if (ABS(colscale._M_data[uVar14]) == 0.0 || ABS(colscale._M_data[uVar14]) == INFINITY) {
        bVar9 = Basis::IsBasic(p_basis,j_00);
        if (bVar9) {
          Basis::FreeBasicVariable(p_basis,j_00);
        }
        else {
          Basis::FixNonbasicVariable(p_basis,j_00);
        }
      }
    }
    for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
      dVar6 = (pMVar4->lb_)._M_data[uVar14];
      pdVar5 = (pMVar4->ub_)._M_data + uVar14;
      if ((dVar6 == *pdVar5) && (!NAN(dVar6) && !NAN(*pdVar5))) {
        BVar10 = Basis::StatusOf(p_basis,(Int)uVar14);
        if (BVar10 == NONBASIC_FIXED) {
          Iterate::make_fixed(iterate,(Int)uVar14,(pMVar4->lb_)._M_data[uVar14]);
        }
      }
    }
    pMVar4 = iterate->model_;
    uVar1 = pMVar4->num_rows_;
    __n = (size_t)(int)uVar1;
    iVar2 = pMVar4->num_cols_;
    dependent_rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    dependent_rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    dependent_rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dependent_cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    dependent_cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    dependent_cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::valarray<double>::valarray(&dx,(long)iVar2 + __n);
    std::valarray<double>::valarray(&dy,__n);
    if (0 < (local_c0->super_ipx_info).dependent_cols) {
      std::valarray<double>::valarray(&dxbasic,__n);
      for (local_c4 = 0; local_c4 < iVar2; local_c4 = local_c4 + 1) {
        if (((ABS((pMVar4->lb_)._M_data[local_c4]) == INFINITY) &&
            (ABS((pMVar4->ub_)._M_data[local_c4]) == INFINITY)) &&
           (bVar9 = Basis::IsNonbasic(p_basis,local_c4), bVar9)) {
          lVar13 = (long)local_c4;
          pdVar5 = (iterate->x_)._M_data;
          dx._M_data[lVar13] = -pdVar5[lVar13];
          ScatterColumn(&pMVar4->AI_,local_c4,pdVar5[lVar13],&dxbasic);
          std::vector<int,_std::allocator<int>_>::push_back(&dependent_cols,&local_c4);
        }
      }
      Basis::SolveDense(p_basis,&dxbasic,&dxbasic,'N');
      uVar12 = 0;
      uVar14 = 0;
      if (0 < (int)uVar1) {
        uVar14 = (ulong)uVar1;
      }
      for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        dx._M_data
        [(p_basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar12]] = dxbasic._M_data[uVar12];
      }
      operator_delete(dxbasic._M_data);
    }
    if (0 < (local_c0->super_ipx_info).dependent_rows) {
      uVar14 = 0;
      uVar12 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar12 = uVar14;
      }
      for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
        iVar3 = (p_basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14];
        if (iVar2 <= iVar3) {
          dVar6 = (pMVar4->lb_)._M_data[iVar3];
          pdVar5 = (pMVar4->ub_)._M_data + iVar3;
          if ((dVar6 == *pdVar5) && (!NAN(dVar6) && !NAN(*pdVar5))) {
            dxbasic._M_size._0_4_ = iVar3 - iVar2;
            dy._M_data[uVar14] = -(iterate->y_)._M_data[(int)dxbasic._M_size];
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&dependent_rows,(int *)&dxbasic);
          }
        }
      }
      Basis::SolveDense(p_basis,&dy,&dy,'T');
      for (piVar11 = dependent_rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar11 !=
          dependent_rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish; piVar11 = piVar11 + 1) {
        dy._M_data[*piVar11] = -(iterate->y_)._M_data[*piVar11];
      }
    }
    pIVar7 = local_c0;
    Iterate::Update(iterate,1.0,dx._M_data,(double *)0x0,(double *)0x0,1.0,dy._M_data,(double *)0x0,
                    (double *)0x0);
    piVar11 = dependent_cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (piVar15 = dependent_cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar8 = dependent_rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        piVar16 = dependent_rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, piVar15 != piVar11; piVar15 = piVar15 + 1) {
      Iterate::make_fixed(iterate,*piVar15,0.0);
    }
    for (; piVar16 != piVar8; piVar16 = piVar16 + 1) {
      Iterate::make_implied_eq(iterate,*piVar16 + iVar2);
    }
    operator_delete(dy._M_data);
    operator_delete(dx._M_data);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dependent_cols.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dependent_rows.super__Vector_base<int,_std::allocator<int>_>);
    Basis::model(p_basis);
    dVar6 = Timer::Elapsed(&timer);
    (pIVar7->super_ipx_info).time_starting_basis =
         dVar6 + (pIVar7->super_ipx_info).time_starting_basis;
  }
  operator_delete(colscale._M_data);
  return;
}

Assistant:

void StartingBasis(Iterate* iterate, Basis* p_basis, Info* info) {
    const Model& model = iterate->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector colscale(n+m);
    Basis& basis = *p_basis;
    info->errflag = 0;
    Timer timer;

    // Construct starting basis. The column weights for the crash procedure are
    // the interior point scaling factors from the current iterate, except that
    // fixed variables get weight zero.
    for (Int j = 0; j < n+m; j++) {
        colscale[j] = iterate->ScalingFactor(j);
        if (std::isinf(lb[j]) && std::isinf(ub[j]))
            assert(colscale[j] == INFINITY);
        else
            assert(std::isfinite(colscale[j]));
        if (lb[j] == ub[j])
            colscale[j] = 0.0;
    }
    basis.ConstructBasisFromWeights(&colscale[0], info);
    if (info->errflag)
        return;

    // Change status of free variables either to BASIC_FREE or NONBASIC_FIXED.
    // Change status of fixed variables either to NONBASIC_FIXED or BASIC_FREE.
    for (Int j = 0; j < n+m; j++) {
        if (colscale[j] == 0.0 || std::isinf(colscale[j])) {
            if (basis.IsBasic(j))
                basis.FreeBasicVariable(j);
            else
                basis.FixNonbasicVariable(j);
        }
    }

    // Variables with equal lower and upper bounds can be removed from the
    // interior point solve if their basic status is NONBASIC_FIXED. Setting
    // x[j] to its bound alters the residual in AI*x=b; this can be ignored
    // because the iterate has not been primal feasible if x[j] was
    // significantly away from its bound.
    for (Int j = 0; j < n+m; j++) {
        if (lb[j] == ub[j] && basis.StatusOf(j) == Basis::NONBASIC_FIXED)
            iterate->make_fixed(j, lb[j]);
    }

    // Linearly dependent rows and columns require adjusting the iterate.
    PostprocessDependencies(iterate, p_basis, info);

    AssertConsistency(*iterate, basis);
    info->time_starting_basis += timer.Elapsed();
}